

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaB_assert(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  lua_State *in_RDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  luaL_checkany(in_RDI,(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  iVar1 = lua_toboolean((lua_State *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                        in_stack_fffffffffffffffc);
  if (iVar1 == 0) {
    pcVar2 = luaL_optlstring(L,unaff_retaddr_00,
                             (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (size_t *)in_RDI);
    iVar1 = luaL_error(in_RDI,"%s",pcVar2);
  }
  else {
    iVar1 = lua_gettop(in_RDI);
  }
  return iVar1;
}

Assistant:

static int luaB_assert(lua_State*L){
luaL_checkany(L,1);
if(!lua_toboolean(L,1))
return luaL_error(L,"%s",luaL_optstring(L,2,"assertion failed!"));
return lua_gettop(L);
}